

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_keypair_seckey_load
              (secp256k1_context *ctx,secp256k1_scalar *sk,secp256k1_keypair *keypair)

{
  int local_2c;
  secp256k1_keypair *psStack_28;
  int ret;
  secp256k1_keypair *keypair_local;
  secp256k1_scalar *sk_local;
  secp256k1_context *ctx_local;
  
  psStack_28 = keypair;
  keypair_local = (secp256k1_keypair *)sk;
  sk_local = (secp256k1_scalar *)ctx;
  local_2c = secp256k1_scalar_set_b32_seckey(sk,keypair->data);
  secp256k1_declassify((secp256k1_context *)sk_local,&local_2c,4);
  if (local_2c == 0) {
    secp256k1_callback_call((secp256k1_callback *)(sk_local[5].d + 3),"ret");
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = local_2c;
  }
  return ctx_local._4_4_;
}

Assistant:

static int secp256k1_keypair_seckey_load(const secp256k1_context* ctx, secp256k1_scalar *sk, const secp256k1_keypair *keypair) {
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(sk, &keypair->data[0]);
    /* We can declassify ret here because sk is only zero if a keypair function
     * failed (which zeroes the keypair) and its return value is ignored. */
    secp256k1_declassify(ctx, &ret, sizeof(ret));
    ARG_CHECK(ret);
    return ret;
}